

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

void __thiscall arm::Function::~Function(Function *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  ::~_Rb_tree(&(this->local_const)._M_t);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector(&this->inst);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Function(std::string& name, std::shared_ptr<mir::types::FunctionTy> ty,
           std::vector<std::unique_ptr<Inst>>&& inst,
           std::map<std::string, ConstValue>&& local_const, uint32_t stack_size)
      : name(name),
        ty(ty),
        inst(std::move(inst)),
        local_const(std::move(local_const)),
        stack_size(stack_size) {}